

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 455.test.cpp
# Opt level: O1

string * chunkWithLDG1LNU1_abi_cxx11_(void)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)in_RDI,
             " 9.223500+4 2.330248+2          1          1          0          09228 1455     \n 0.000000+0 0.000000+0          0          0          1          29228 1455     \n          2          4                                            9228 1455     \n 0.000000+0 1.000000-5          0          0         12          09228 1455     \n 1.000000+0 1.100000+0 2.000000+0 2.100000+0 3.000000+0 3.100000+09228 1455     \n 4.000000+0 4.100000+0 5.000000+0 5.100000+0 6.000000+0 6.100000+09228 1455     \n 0.000000+0 2.000000+7          0          0         12          09228 1455     \n 6.000000+0 6.100000+0 5.000000+0 5.100000+0 4.000000+0 4.100000+09228 1455     \n 3.000000+0 3.100000+0 2.000000+0 2.100000+0 1.000000+0 1.100000+09228 1455     \n 0.000000+0 0.000000+0          0          0          2          09228 1455     \n 2.436700+0 5.000000-2                                            9228 1455     \n"
             ,"");
  return in_RDI;
}

Assistant:

std::string chunkWithLDG1LNU1() {
  return
    " 9.223500+4 2.330248+2          1          1          0          09228 1455     \n"
    " 0.000000+0 0.000000+0          0          0          1          29228 1455     \n"
    "          2          4                                            9228 1455     \n"
    " 0.000000+0 1.000000-5          0          0         12          09228 1455     \n"
    " 1.000000+0 1.100000+0 2.000000+0 2.100000+0 3.000000+0 3.100000+09228 1455     \n"
    " 4.000000+0 4.100000+0 5.000000+0 5.100000+0 6.000000+0 6.100000+09228 1455     \n"
    " 0.000000+0 2.000000+7          0          0         12          09228 1455     \n"
    " 6.000000+0 6.100000+0 5.000000+0 5.100000+0 4.000000+0 4.100000+09228 1455     \n"
    " 3.000000+0 3.100000+0 2.000000+0 2.100000+0 1.000000+0 1.100000+09228 1455     \n"
    " 0.000000+0 0.000000+0          0          0          2          09228 1455     \n"
    " 2.436700+0 5.000000-2                                            9228 1455     \n";
}